

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 floatx80_logn_m68k(floatx80 a,float_status *status)

{
  char cVar1;
  char cVar2;
  undefined8 uVar3;
  undefined2 uVar4;
  undefined8 uVar5;
  undefined2 uVar6;
  unkuint10 Var7;
  unkuint10 Var8;
  unkuint10 Var9;
  float_status *pfVar10;
  uint16_t uVar11;
  int32_t iVar12;
  uint uVar13;
  ulong zSig;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 a_07;
  floatx80 a_08;
  floatx80 a_09;
  floatx80 a_10;
  floatx80 a_11;
  floatx80 a_12;
  floatx80 a_13;
  floatx80 a_14;
  floatx80 a_15;
  floatx80 a_16;
  floatx80 a_17;
  floatx80 a_18;
  floatx80 a_19;
  floatx80 a_20;
  floatx80 a_21;
  floatx80 a_22;
  floatx80 a_23;
  floatx80 a_24;
  floatx80 a_25;
  floatx80 a_26;
  floatx80 a_27;
  floatx80 a_28;
  floatx80 a_29;
  floatx80 a_30;
  floatx80 a_31;
  floatx80 a_32;
  floatx80 a_33;
  floatx80 a_34;
  floatx80 a_35;
  floatx80 b;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 b_02;
  floatx80 b_03;
  floatx80 b_04;
  floatx80 b_05;
  floatx80 b_06;
  floatx80 b_07;
  floatx80 b_08;
  floatx80 b_09;
  floatx80 b_10;
  floatx80 b_11;
  floatx80 b_12;
  floatx80 b_13;
  floatx80 b_14;
  floatx80 b_15;
  floatx80 b_16;
  floatx80 b_17;
  floatx80 b_18;
  floatx80 b_19;
  floatx80 b_20;
  floatx80 b_21;
  floatx80 b_22;
  floatx80 b_23;
  floatx80 b_24;
  floatx80 b_25;
  floatx80 b_26;
  floatx80 b_27;
  floatx80 b_28;
  floatx80 b_29;
  floatx80 b_30;
  floatx80 b_31;
  floatx80 b_32;
  floatx80 b_33;
  floatx80 b_34;
  floatx80 fVar14;
  floatx80 fVar15;
  floatx80 fVar16;
  floatx80 fVar17;
  floatx80 fVar18;
  floatx80 fVar19;
  floatx80 saveu;
  floatx80 klog2;
  floatx80 logof2;
  floatx80 f;
  floatx80 fp3;
  floatx80 fp2;
  floatx80 fp1;
  floatx80 fp0;
  int32_t adjk;
  int32_t k;
  int32_t j;
  int32_t compact;
  int8_t user_rnd_prec;
  int8_t user_rnd_mode;
  uint64_t fSig;
  uint64_t aSig;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  floatx80 a_local;
  
  status_local = (float_status *)a.low;
  a_local.low._0_2_ = a.high;
  fVar15._10_6_ = 0;
  fVar15.low = (long)a._0_10_;
  fVar15.high = (short)(a._0_10_ >> 0x40);
  _aExp = status;
  fSig = extractFloatx80Frac(fVar15);
  fVar16.high = (uint16_t)a_local.low;
  fVar16.low = (uint64_t)status_local;
  fVar16._10_6_ = 0;
  aSig._0_4_ = extractFloatx80Exp(fVar16);
  fVar17.high = (uint16_t)a_local.low;
  fVar17.low = (uint64_t)status_local;
  fVar17._10_6_ = 0;
  aSig._7_1_ = extractFloatx80Sign(fVar17);
  if ((int)aSig == 0x7fff) {
    if ((fSig & 0x7fffffffffffffff) != 0) {
      fVar18.high = (uint16_t)a_local.low;
      fVar18.low = (uint64_t)status_local;
      fVar18._10_6_ = 0;
      propagateFloatx80NaNOneArg(fVar18,_aExp);
    }
    if (aSig._7_1_ == '\0') {
      fVar14 = packFloatx80('\0',0x7fff,0);
      a_local.low._0_2_ = fVar14.high;
      goto LAB_008b2cb5;
    }
  }
  fp0._12_4_ = 0;
  if ((int)aSig == 0) {
    if (fSig == 0) {
      float_raise_m68k('\x04',_aExp);
      fVar14 = packFloatx80('\x01',0x7fff,0);
      a_local.low._0_2_ = fVar14.high;
      goto LAB_008b2cb5;
    }
    if ((fSig & 0x8000000000000000) == 0) {
      normalizeFloatx80Subnormal_m68k(fSig,(int32_t *)&aSig,&fSig);
      fp0._12_4_ = 0xffffff9c;
      aSig._0_4_ = (int)aSig + 100;
      fVar15 = packFloatx80(aSig._7_1_,(int)aSig,fSig);
      status_local = (float_status *)fVar15.low;
      a_local.low._0_2_ = fVar15.high;
    }
  }
  if (aSig._7_1_ == '\0') {
    cVar1 = _aExp->float_rounding_mode;
    cVar2 = _aExp->floatx80_rounding_precision;
    _aExp->float_rounding_mode = '\0';
    _aExp->floatx80_rounding_precision = 'P';
    iVar12 = floatx80_make_compact((int)aSig,fSig);
    uVar11 = (uint16_t)a_local.low;
    pfVar10 = status_local;
    if ((iVar12 < 0x3ffef07d) || (0x3fff8841 < iVar12)) {
      fVar15 = int32_to_floatx80_m68k(fp0._12_4_ + (int)aSig + -0x3fff,_aExp);
      zSig = fSig & 0xfe00000000000000 | 0x100000000000000;
      uVar13 = (byte)(zSig >> 0x38) & 0x7e;
      fVar16 = packFloatx80('\0',0x3fff,zSig);
      fVar17 = packFloatx80('\0',0x3fff,fSig);
      a_00._10_6_ = 0;
      a_00.low = (long)fVar17._0_10_;
      a_00.high = (short)(fVar17._0_10_ >> 0x40);
      b._10_6_ = 0;
      b.low = (long)fVar16._0_10_;
      b.high = (short)(fVar16._0_10_ >> 0x40);
      fVar16 = floatx80_sub_m68k(a_00,b,_aExp);
      uVar3 = log_tbl[(int)uVar13].low;
      uVar4 = log_tbl[(int)uVar13].high;
      b_00.high = uVar4;
      b_00.low = uVar3;
      a_01._10_6_ = 0;
      a_01.low = (long)fVar16._0_10_;
      a_01.high = (short)(fVar16._0_10_ >> 0x40);
      b_00._10_6_ = 0;
      fVar16 = floatx80_mul_m68k(a_01,b_00,_aExp);
      fVar17 = packFloatx80('\0',0x3ffe,0xb17217f7d1cf79ac);
      a_02._10_6_ = 0;
      a_02.low = (long)fVar15._0_10_;
      a_02.high = (short)(fVar15._0_10_ >> 0x40);
      b_01._10_6_ = 0;
      b_01.low = (long)fVar17._0_10_;
      b_01.high = (short)(fVar17._0_10_ >> 0x40);
      fVar15 = floatx80_mul_m68k(a_02,b_01,_aExp);
      Var8 = fVar16._0_10_;
      a_03._10_6_ = 0;
      a_03.low = (long)Var8;
      a_03.high = (short)(Var8 >> 0x40);
      b_02._10_6_ = 0;
      b_02.low = (long)Var8;
      b_02.high = (short)(Var8 >> 0x40);
      fVar16 = floatx80_mul_m68k(a_03,b_02,_aExp);
      fVar17 = float64_to_floatx80_m68k(0x3fc2499ab5e4040b,_aExp);
      Var7 = fVar16._0_10_;
      a_04._10_6_ = 0;
      a_04.low = (long)Var7;
      a_04.high = (short)(Var7 >> 0x40);
      b_03._10_6_ = 0;
      b_03.low = (long)fVar17._0_10_;
      b_03.high = (short)(fVar17._0_10_ >> 0x40);
      fVar16 = floatx80_mul_m68k(a_04,b_03,_aExp);
      fVar17 = float64_to_floatx80_m68k(0xbfc555b5848cb7db,_aExp);
      a_05._10_6_ = 0;
      a_05.low = (long)Var7;
      a_05.high = (short)(Var7 >> 0x40);
      b_04._10_6_ = 0;
      b_04.low = (long)fVar17._0_10_;
      b_04.high = (short)(fVar17._0_10_ >> 0x40);
      fVar17 = floatx80_mul_m68k(a_05,b_04,_aExp);
      fVar18 = float64_to_floatx80_m68k(0x3fc99999987d8730,_aExp);
      a_06._10_6_ = 0;
      a_06.low = (long)fVar16._0_10_;
      a_06.high = (short)(fVar16._0_10_ >> 0x40);
      b_05._10_6_ = 0;
      b_05.low = (long)fVar18._0_10_;
      b_05.high = (short)(fVar18._0_10_ >> 0x40);
      fVar16 = floatx80_add_m68k(a_06,b_05,_aExp);
      fVar18 = float64_to_floatx80_m68k(0xbfcfffffff6f7e97,_aExp);
      a_07._10_6_ = 0;
      a_07.low = (long)fVar17._0_10_;
      a_07.high = (short)(fVar17._0_10_ >> 0x40);
      b_06._10_6_ = 0;
      b_06.low = (long)fVar18._0_10_;
      b_06.high = (short)(fVar18._0_10_ >> 0x40);
      fVar17 = floatx80_add_m68k(a_07,b_06,_aExp);
      a_08._10_6_ = 0;
      a_08.low = (long)fVar16._0_10_;
      a_08.high = (short)(fVar16._0_10_ >> 0x40);
      b_07._10_6_ = 0;
      b_07.low = (long)Var7;
      b_07.high = (short)(Var7 >> 0x40);
      fVar16 = floatx80_mul_m68k(a_08,b_07,_aExp);
      a_09._10_6_ = 0;
      a_09.low = (long)fVar17._0_10_;
      a_09.high = (short)(fVar17._0_10_ >> 0x40);
      b_08._10_6_ = 0;
      b_08.low = (long)Var7;
      b_08.high = (short)(Var7 >> 0x40);
      fVar17 = floatx80_mul_m68k(a_09,b_08,_aExp);
      fVar18 = float64_to_floatx80_m68k(0x3fd55555555555a4,_aExp);
      a_10._10_6_ = 0;
      a_10.low = (long)fVar16._0_10_;
      a_10.high = (short)(fVar16._0_10_ >> 0x40);
      b_09._10_6_ = 0;
      b_09.low = (long)fVar18._0_10_;
      b_09.high = (short)(fVar18._0_10_ >> 0x40);
      fVar16 = floatx80_add_m68k(a_10,b_09,_aExp);
      fVar18 = float64_to_floatx80_m68k(0xbfe0000000000008,_aExp);
      a_11._10_6_ = 0;
      a_11.low = (long)fVar17._0_10_;
      a_11.high = (short)(fVar17._0_10_ >> 0x40);
      b_10._10_6_ = 0;
      b_10.low = (long)fVar18._0_10_;
      b_10.high = (short)(fVar18._0_10_ >> 0x40);
      fVar17 = floatx80_add_m68k(a_11,b_10,_aExp);
      a_12._10_6_ = 0;
      a_12.low = (long)fVar16._0_10_;
      a_12.high = (short)(fVar16._0_10_ >> 0x40);
      b_11._10_6_ = 0;
      b_11.low = (long)Var7;
      b_11.high = (short)(Var7 >> 0x40);
      fVar16 = floatx80_mul_m68k(a_12,b_11,_aExp);
      a_13._10_6_ = 0;
      a_13.low = (long)fVar17._0_10_;
      a_13.high = (short)(fVar17._0_10_ >> 0x40);
      b_12._10_6_ = 0;
      b_12.low = (long)Var7;
      b_12.high = (short)(Var7 >> 0x40);
      fVar17 = floatx80_mul_m68k(a_13,b_12,_aExp);
      a_14._10_6_ = 0;
      a_14.low = (long)fVar16._0_10_;
      a_14.high = (short)(fVar16._0_10_ >> 0x40);
      b_13._10_6_ = 0;
      b_13.low = (long)Var8;
      b_13.high = (short)(Var8 >> 0x40);
      fVar16 = floatx80_mul_m68k(a_14,b_13,_aExp);
      a_15._10_6_ = 0;
      a_15.low = (long)Var8;
      a_15.high = (short)(Var8 >> 0x40);
      b_14._10_6_ = 0;
      b_14.low = (long)fVar17._0_10_;
      b_14.high = (short)(fVar17._0_10_ >> 0x40);
      fVar17 = floatx80_add_m68k(a_15,b_14,_aExp);
      uVar5 = log_tbl[(int)(uVar13 + 1)].low;
      uVar6 = log_tbl[(int)(uVar13 + 1)].high;
      b_15.high = uVar6;
      b_15.low = uVar5;
      a_16._10_6_ = 0;
      a_16.low = (long)fVar16._0_10_;
      a_16.high = (short)(fVar16._0_10_ >> 0x40);
      b_15._10_6_ = 0;
      fVar16 = floatx80_add_m68k(a_16,b_15,_aExp);
      a_17._10_6_ = 0;
      a_17.low = (long)fVar17._0_10_;
      a_17.high = (short)(fVar17._0_10_ >> 0x40);
      b_16._10_6_ = 0;
      b_16.low = (long)fVar16._0_10_;
      b_16.high = (short)(fVar16._0_10_ >> 0x40);
      fVar16 = floatx80_add_m68k(a_17,b_16,_aExp);
      _aExp->float_rounding_mode = cVar1;
      _aExp->floatx80_rounding_precision = cVar2;
      a_18._10_6_ = 0;
      a_18.low = (long)fVar16._0_10_;
      a_18.high = (short)(fVar16._0_10_ >> 0x40);
      b_17._10_6_ = 0;
      b_17.low = (long)fVar15._0_10_;
      b_17.high = (short)(fVar15._0_10_ >> 0x40);
      fVar15 = floatx80_add_m68k(a_18,b_17,_aExp);
      status_local = (float_status *)fVar15.low;
      a_local.low._0_2_ = fVar15.high;
      float_raise_m68k(' ',_aExp);
      fVar14._8_8_ = extraout_RDX;
      fVar14.low = (uint64_t)status_local;
    }
    else {
      fVar15 = float32_to_floatx80_m68k(0x3f800000,_aExp);
      a_19.high = uVar11;
      a_19.low = (uint64_t)pfVar10;
      a_19._10_6_ = 0;
      b_18._10_6_ = 0;
      b_18.low = (long)fVar15._0_10_;
      b_18.high = (short)(fVar15._0_10_ >> 0x40);
      fVar15 = floatx80_sub_m68k(a_19,b_18,_aExp);
      fVar16 = float32_to_floatx80_m68k(0x3f800000,_aExp);
      a_20.high = uVar11;
      a_20.low = (uint64_t)pfVar10;
      a_20._10_6_ = 0;
      b_19._10_6_ = 0;
      b_19.low = (long)fVar16._0_10_;
      b_19.high = (short)(fVar16._0_10_ >> 0x40);
      fVar16 = floatx80_add_m68k(a_20,b_19,_aExp);
      Var7 = fVar15._0_10_;
      a_21._10_6_ = 0;
      a_21.low = (long)Var7;
      a_21.high = (short)(Var7 >> 0x40);
      b_20._10_6_ = 0;
      b_20.low = (long)Var7;
      b_20.high = (short)(Var7 >> 0x40);
      fVar15 = floatx80_add_m68k(a_21,b_20,_aExp);
      a_22._10_6_ = 0;
      a_22.low = (long)fVar15._0_10_;
      a_22.high = (short)(fVar15._0_10_ >> 0x40);
      b_21._10_6_ = 0;
      b_21.low = (long)fVar16._0_10_;
      b_21.high = (short)(fVar16._0_10_ >> 0x40);
      fVar15 = floatx80_div_m68k(a_22,b_21,_aExp);
      Var7 = fVar15._0_10_;
      a_23._10_6_ = 0;
      a_23.low = (long)Var7;
      a_23.high = (short)(Var7 >> 0x40);
      b_22._10_6_ = 0;
      b_22.low = (long)Var7;
      b_22.high = (short)(Var7 >> 0x40);
      fVar15 = floatx80_mul_m68k(a_23,b_22,_aExp);
      Var9 = fVar15._0_10_;
      a_24._10_6_ = 0;
      a_24.low = (long)Var9;
      a_24.high = (short)(Var9 >> 0x40);
      b_23._10_6_ = 0;
      b_23.low = (long)Var9;
      b_23.high = (short)(Var9 >> 0x40);
      fVar15 = floatx80_mul_m68k(a_24,b_23,_aExp);
      fVar16 = float64_to_floatx80_m68k(0x3f175496add7dad6,_aExp);
      fVar17 = float64_to_floatx80_m68k(0x3f3c71c2fe80c7e0,_aExp);
      Var8 = fVar15._0_10_;
      a_25._10_6_ = 0;
      a_25.low = (long)fVar16._0_10_;
      a_25.high = (short)(fVar16._0_10_ >> 0x40);
      b_24._10_6_ = 0;
      b_24.low = (long)Var8;
      b_24.high = (short)(Var8 >> 0x40);
      fVar15 = floatx80_mul_m68k(a_25,b_24,_aExp);
      a_26._10_6_ = 0;
      a_26.low = (long)fVar17._0_10_;
      a_26.high = (short)(fVar17._0_10_ >> 0x40);
      b_25._10_6_ = 0;
      b_25.low = (long)Var8;
      b_25.high = (short)(Var8 >> 0x40);
      fVar16 = floatx80_mul_m68k(a_26,b_25,_aExp);
      fVar17 = float64_to_floatx80_m68k(0x3f624924928bccff,_aExp);
      a_27._10_6_ = 0;
      a_27.low = (long)fVar15._0_10_;
      a_27.high = (short)(fVar15._0_10_ >> 0x40);
      b_26._10_6_ = 0;
      b_26.low = (long)fVar17._0_10_;
      b_26.high = (short)(fVar17._0_10_ >> 0x40);
      fVar15 = floatx80_add_m68k(a_27,b_26,_aExp);
      fVar17 = float64_to_floatx80_m68k(0x3f899999999995ec,_aExp);
      a_28._10_6_ = 0;
      a_28.low = (long)fVar16._0_10_;
      a_28.high = (short)(fVar16._0_10_ >> 0x40);
      b_27._10_6_ = 0;
      b_27.low = (long)fVar17._0_10_;
      b_27.high = (short)(fVar17._0_10_ >> 0x40);
      fVar16 = floatx80_add_m68k(a_28,b_27,_aExp);
      a_29._10_6_ = 0;
      a_29.low = (long)Var8;
      a_29.high = (short)(Var8 >> 0x40);
      b_28._10_6_ = 0;
      b_28.low = (long)fVar15._0_10_;
      b_28.high = (short)(fVar15._0_10_ >> 0x40);
      fVar15 = floatx80_mul_m68k(a_29,b_28,_aExp);
      a_30._10_6_ = 0;
      a_30.low = (long)fVar16._0_10_;
      a_30.high = (short)(fVar16._0_10_ >> 0x40);
      b_29._10_6_ = 0;
      b_29.low = (long)Var9;
      b_29.high = (short)(Var9 >> 0x40);
      fVar16 = floatx80_mul_m68k(a_30,b_29,_aExp);
      fVar17 = float64_to_floatx80_m68k(0x3fb5555555555555,_aExp);
      a_31._10_6_ = 0;
      a_31.low = (long)fVar15._0_10_;
      a_31.high = (short)(fVar15._0_10_ >> 0x40);
      b_30._10_6_ = 0;
      b_30.low = (long)fVar17._0_10_;
      b_30.high = (short)(fVar17._0_10_ >> 0x40);
      fVar15 = floatx80_add_m68k(a_31,b_30,_aExp);
      a_32._10_6_ = 0;
      a_32.low = (long)Var9;
      a_32.high = (short)(Var9 >> 0x40);
      b_31._10_6_ = 0;
      b_31.low = (long)Var7;
      b_31.high = (short)(Var7 >> 0x40);
      fVar17 = floatx80_mul_m68k(a_32,b_31,_aExp);
      a_33._10_6_ = 0;
      a_33.low = (long)fVar15._0_10_;
      a_33.high = (short)(fVar15._0_10_ >> 0x40);
      b_32._10_6_ = 0;
      b_32.low = (long)fVar16._0_10_;
      b_32.high = (short)(fVar16._0_10_ >> 0x40);
      fVar15 = floatx80_add_m68k(a_33,b_32,_aExp);
      a_34._10_6_ = 0;
      a_34.low = (long)fVar17._0_10_;
      a_34.high = (short)(fVar17._0_10_ >> 0x40);
      b_33._10_6_ = 0;
      b_33.low = (long)fVar15._0_10_;
      b_33.high = (short)(fVar15._0_10_ >> 0x40);
      fVar15 = floatx80_mul_m68k(a_34,b_33,_aExp);
      _aExp->float_rounding_mode = cVar1;
      _aExp->floatx80_rounding_precision = cVar2;
      a_35._10_6_ = 0;
      a_35.low = (long)fVar15._0_10_;
      a_35.high = (short)(fVar15._0_10_ >> 0x40);
      b_34._10_6_ = 0;
      b_34.low = (long)Var7;
      b_34.high = (short)(Var7 >> 0x40);
      fVar15 = floatx80_add_m68k(a_35,b_34,_aExp);
      status_local = (float_status *)fVar15.low;
      a_local.low._0_2_ = fVar15.high;
      float_raise_m68k(' ',_aExp);
      fVar14._8_8_ = extraout_RDX_00;
      fVar14.low = (uint64_t)status_local;
    }
  }
  else {
    float_raise_m68k('\x01',_aExp);
    fVar14 = floatx80_default_nan_m68k(_aExp);
    a_local.low._0_2_ = fVar14.high;
  }
LAB_008b2cb5:
  a_local._8_8_ = fVar14.low;
  fVar19._10_6_ = fVar14._10_6_;
  fVar19.high = (uint16_t)a_local.low;
  fVar19.low = a_local._8_8_;
  return fVar19;
}

Assistant:

floatx80 floatx80_logn(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig, fSig;

    int8_t user_rnd_mode, user_rnd_prec;

    int32_t compact, j, k, adjk;
    floatx80 fp0, fp1, fp2, fp3, f, logof2, klog2, saveu;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            propagateFloatx80NaNOneArg(a, status);
        }
        if (aSign == 0) {
            return packFloatx80(0, floatx80_infinity.high,
                                floatx80_infinity.low);
        }
    }

    adjk = 0;

    if (aExp == 0) {
        if (aSig == 0) { /* zero */
            float_raise(float_flag_divbyzero, status);
            return packFloatx80(1, floatx80_infinity.high,
                                floatx80_infinity.low);
        }
        if ((aSig & one_sig) == 0) { /* denormal */
            normalizeFloatx80Subnormal(aSig, &aExp, &aSig);
            adjk = -100;
            aExp += 100;
            a = packFloatx80(aSign, aExp, aSig);
        }
    }

    if (aSign) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    compact = floatx80_make_compact(aExp, aSig);

    if (compact < 0x3FFEF07D || compact > 0x3FFF8841) {
        /* |X| < 15/16 or |X| > 17/16 */
        k = aExp - 0x3FFF;
        k += adjk;
        fp1 = int32_to_floatx80(k, status);

        fSig = (aSig & UINT64_C(0xFE00000000000000)) | UINT64_C(0x0100000000000000);
        j = (fSig >> 56) & 0x7E; /* DISPLACEMENT FOR 1/F */

        f = packFloatx80(0, 0x3FFF, fSig); /* F */
        fp0 = packFloatx80(0, 0x3FFF, aSig); /* Y */

        fp0 = floatx80_sub(fp0, f, status); /* Y-F */

        /* LP1CONT1 */
        fp0 = floatx80_mul(fp0, log_tbl[j], status); /* FP0 IS U = (Y-F)/F */
        logof2 = packFloatx80(0, 0x3FFE, UINT64_C(0xB17217F7D1CF79AC));
        klog2 = floatx80_mul(fp1, logof2, status); /* FP1 IS K*LOG2 */
        fp2 = floatx80_mul(fp0, fp0, status); /* FP2 IS V=U*U */

        fp3 = fp2;
        fp1 = fp2;

        fp1 = floatx80_mul(fp1, float64_to_floatx80(
                           make_float64(0x3FC2499AB5E4040B), status),
                           status); /* V*A6 */
        fp2 = floatx80_mul(fp2, float64_to_floatx80(
                           make_float64(0xBFC555B5848CB7DB), status),
                           status); /* V*A5 */
        fp1 = floatx80_add(fp1, float64_to_floatx80(
                           make_float64(0x3FC99999987D8730), status),
                           status); /* A4+V*A6 */
        fp2 = floatx80_add(fp2, float64_to_floatx80(
                           make_float64(0xBFCFFFFFFF6F7E97), status),
                           status); /* A3+V*A5 */
        fp1 = floatx80_mul(fp1, fp3, status); /* V*(A4+V*A6) */
        fp2 = floatx80_mul(fp2, fp3, status); /* V*(A3+V*A5) */
        fp1 = floatx80_add(fp1, float64_to_floatx80(
                           make_float64(0x3FD55555555555A4), status),
                           status); /* A2+V*(A4+V*A6) */
        fp2 = floatx80_add(fp2, float64_to_floatx80(
                           make_float64(0xBFE0000000000008), status),
                           status); /* A1+V*(A3+V*A5) */
        fp1 = floatx80_mul(fp1, fp3, status); /* V*(A2+V*(A4+V*A6)) */
        fp2 = floatx80_mul(fp2, fp3, status); /* V*(A1+V*(A3+V*A5)) */
        fp1 = floatx80_mul(fp1, fp0, status); /* U*V*(A2+V*(A4+V*A6)) */
        fp0 = floatx80_add(fp0, fp2, status); /* U+V*(A1+V*(A3+V*A5)) */

        fp1 = floatx80_add(fp1, log_tbl[j + 1],
                           status); /* LOG(F)+U*V*(A2+V*(A4+V*A6)) */
        fp0 = floatx80_add(fp0, fp1, status); /* FP0 IS LOG(F) + LOG(1+U) */

        status->float_rounding_mode = user_rnd_mode;
        status->floatx80_rounding_precision = user_rnd_prec;

        a = floatx80_add(fp0, klog2, status);

        float_raise(float_flag_inexact, status);

        return a;
    } else { /* |X-1| >= 1/16 */
        fp0 = a;
        fp1 = a;
        fp1 = floatx80_sub(fp1, float32_to_floatx80(make_float32(0x3F800000),
                           status), status); /* FP1 IS X-1 */
        fp0 = floatx80_add(fp0, float32_to_floatx80(make_float32(0x3F800000),
                           status), status); /* FP0 IS X+1 */
        fp1 = floatx80_add(fp1, fp1, status); /* FP1 IS 2(X-1) */

        /* LP1CONT2 */
        fp1 = floatx80_div(fp1, fp0, status); /* U */
        saveu = fp1;
        fp0 = floatx80_mul(fp1, fp1, status); /* FP0 IS V = U*U */
        fp1 = floatx80_mul(fp0, fp0, status); /* FP1 IS W = V*V */

        fp3 = float64_to_floatx80(make_float64(0x3F175496ADD7DAD6),
                                  status); /* B5 */
        fp2 = float64_to_floatx80(make_float64(0x3F3C71C2FE80C7E0),
                                  status); /* B4 */
        fp3 = floatx80_mul(fp3, fp1, status); /* W*B5 */
        fp2 = floatx80_mul(fp2, fp1, status); /* W*B4 */
        fp3 = floatx80_add(fp3, float64_to_floatx80(
                           make_float64(0x3F624924928BCCFF), status),
                           status); /* B3+W*B5 */
        fp2 = floatx80_add(fp2, float64_to_floatx80(
                           make_float64(0x3F899999999995EC), status),
                           status); /* B2+W*B4 */
        fp1 = floatx80_mul(fp1, fp3, status); /* W*(B3+W*B5) */
        fp2 = floatx80_mul(fp2, fp0, status); /* V*(B2+W*B4) */
        fp1 = floatx80_add(fp1, float64_to_floatx80(
                           make_float64(0x3FB5555555555555), status),
                           status); /* B1+W*(B3+W*B5) */

        fp0 = floatx80_mul(fp0, saveu, status); /* FP0 IS U*V */
        fp1 = floatx80_add(fp1, fp2, status); /* B1+W*(B3+W*B5) + V*(B2+W*B4) */
        fp0 = floatx80_mul(fp0, fp1,
                           status); /* U*V*([B1+W*(B3+W*B5)] + [V*(B2+W*B4)]) */

        status->float_rounding_mode = user_rnd_mode;
        status->floatx80_rounding_precision = user_rnd_prec;

        a = floatx80_add(fp0, saveu, status);

        /*if (!floatx80_is_zero(a)) { */
            float_raise(float_flag_inexact, status);
        /*} */

        return a;
    }
}